

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void savelineinfo(FuncState *fs,Proto *f,int line)

{
  byte bVar1;
  int nelems;
  int iVar2;
  AbsLineInfo *pAVar3;
  ls_byte *plVar4;
  int local_20;
  int pc;
  int linedif;
  int line_local;
  Proto *f_local;
  FuncState *fs_local;
  
  local_20 = line - fs->previousline;
  nelems = fs->pc + -1;
  iVar2 = local_20;
  if (local_20 < 1) {
    iVar2 = -local_20;
  }
  if ((0x7f < iVar2) || (bVar1 = fs->iwthabs, fs->iwthabs = bVar1 + 1, 0x7f < bVar1)) {
    pAVar3 = (AbsLineInfo *)
             luaM_growaux_(fs->ls->L,f->abslineinfo,fs->nabslineinfo,&f->sizeabslineinfo,8,
                           0x7fffffff,"lines");
    f->abslineinfo = pAVar3;
    f->abslineinfo[fs->nabslineinfo].pc = nelems;
    pAVar3 = f->abslineinfo;
    iVar2 = fs->nabslineinfo;
    fs->nabslineinfo = iVar2 + 1;
    pAVar3[iVar2].line = line;
    local_20 = -0x80;
    fs->iwthabs = '\x01';
  }
  plVar4 = (ls_byte *)
           luaM_growaux_(fs->ls->L,f->lineinfo,nelems,&f->sizelineinfo,1,0x7fffffff,"opcodes");
  f->lineinfo = plVar4;
  f->lineinfo[nelems] = (ls_byte)local_20;
  fs->previousline = line;
  return;
}

Assistant:

static void savelineinfo (FuncState *fs, Proto *f, int line) {
  int linedif = line - fs->previousline;
  int pc = fs->pc - 1;  /* last instruction coded */
  if (abs(linedif) >= LIMLINEDIFF || fs->iwthabs++ >= MAXIWTHABS) {
    luaM_growvector(fs->ls->L, f->abslineinfo, fs->nabslineinfo,
                    f->sizeabslineinfo, AbsLineInfo, INT_MAX, "lines");
    f->abslineinfo[fs->nabslineinfo].pc = pc;
    f->abslineinfo[fs->nabslineinfo++].line = line;
    linedif = ABSLINEINFO;  /* signal that there is absolute information */
    fs->iwthabs = 1;  /* restart counter */
  }
  luaM_growvector(fs->ls->L, f->lineinfo, pc, f->sizelineinfo, ls_byte,
                  INT_MAX, "opcodes");
  f->lineinfo[pc] = cast(ls_byte, linedif);
  fs->previousline = line;  /* last line saved */
}